

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O3

RealType OpenMD::MoLocator::getAtomMass(string *at,ForceField *myFF)

{
  AtomType *this;
  ostream *poVar1;
  RealType RVar2;
  
  this = ForceField::getAtomType(myFF,at);
  if (this != (AtomType *)0x0) {
    RVar2 = AtomType::getMass(this);
    return RVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Can not find AtomType: ",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(at->_M_dataplus)._M_p,at->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0.0;
}

Assistant:

RealType MoLocator::getAtomMass(const std::string& at, ForceField* myFF) {
    RealType mass;
    AtomType* atomType = myFF->getAtomType(at);
    if (atomType != NULL) {
      mass = atomType->getMass();
    } else {
      mass = 0.0;
      std::cerr << "Can not find AtomType: " << at << std::endl;
    }
    return mass;
  }